

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O1

upb_StringView upb_strtable_iter_key(upb_strtable_iter *i)

{
  upb_strtable *puVar1;
  upb_SizePrefixString *puVar2;
  upb_StringView uVar3;
  
  puVar1 = i->t;
  if (((puVar1 != (upb_strtable *)0x0) && (i->index < (ulong)((puVar1->t).mask + 1))) &&
     ((puVar1->t).entries[i->index].key.num != 0)) {
    puVar2 = (puVar1->t).entries[i->index].key.str;
    uVar3.data = puVar2 + 1;
    uVar3.size._0_4_ = puVar2->size;
    uVar3.size._4_4_ = 0;
    return uVar3;
  }
  __assert_fail("!upb_strtable_done(i)",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/hash/common.c"
                ,0x228,"upb_StringView upb_strtable_iter_key(const upb_strtable_iter *)");
}

Assistant:

upb_StringView upb_strtable_iter_key(const upb_strtable_iter* i) {
  UPB_ASSERT(!upb_strtable_done(i));
  return upb_key_strview(str_tabent(i)->key);
}